

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfd_elements_address.cpp
# Opt level: O0

void __thiscall
ElementsAddressFactory_Constructor_type_Test::TestBody
          (ElementsAddressFactory_Constructor_type_Test *this)

{
  bool bVar1;
  ElementsAddressFactory factory_1;
  ElementsAddressFactory factory;
  AssertHelper local_90;
  Message local_88 [6];
  NetType in_stack_ffffffffffffffac;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_ffffffffffffffb0;
  
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::ElementsAddressFactory::ElementsAddressFactory
                ((ElementsAddressFactory *)in_stack_ffffffffffffffb0.ptr_,in_stack_ffffffffffffffac)
      ;
      cfd::ElementsAddressFactory::~ElementsAddressFactory((ElementsAddressFactory *)0x1f02aa);
    }
  }
  else {
    testing::Message::Message((Message *)&stack0xffffffffffffffb0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xffffffffffffffa8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_elements_address.cpp"
               ,0x22,
               "Expected: ElementsAddressFactory factory(NetType::kLiquidV1) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&stack0xffffffffffffffa8,(Message *)&stack0xffffffffffffffb0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffffa8);
    testing::Message::~Message((Message *)0x1f0338);
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::ElementsAddressFactory::ElementsAddressFactory
                ((ElementsAddressFactory *)in_stack_ffffffffffffffb0.ptr_,in_stack_ffffffffffffffac)
      ;
      cfd::ElementsAddressFactory::~ElementsAddressFactory((ElementsAddressFactory *)0x1f03b8);
    }
  }
  else {
    testing::Message::Message(local_88);
    testing::internal::AssertHelper::AssertHelper
              (&local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_elements_address.cpp"
               ,0x23,
               "Expected: ElementsAddressFactory factory(NetType::kElementsRegtest) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_90,local_88);
    testing::internal::AssertHelper::~AssertHelper(&local_90);
    testing::Message::~Message((Message *)0x1f0446);
  }
  return;
}

Assistant:

TEST(ElementsAddressFactory, Constructor_type)
{
  EXPECT_NO_THROW(ElementsAddressFactory factory(NetType::kLiquidV1));
  EXPECT_NO_THROW(ElementsAddressFactory factory(NetType::kElementsRegtest));
}